

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

bool benchmarkMany(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                  pospopcnt_u16_method_type fn,bool verbose,bool test,bool tabular)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  result_type rVar6;
  int iVar7;
  undefined8 extraout_RAX;
  pointer pvVar8;
  pointer puVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  pointer puVar13;
  long lVar14;
  char *__format;
  undefined7 in_register_00000089;
  ulong uVar15;
  long lVar16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *x;
  pointer pvVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  pospopcnt_u16_method_type p_Var21;
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_ZMM2 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  allocator_type local_296d;
  uint32_t local_296c;
  byte local_2968;
  undefined3 uStack_2967;
  allocator_type local_2961;
  ulong local_2960;
  double local_2958;
  pospopcnt_u16_method_type local_2950;
  undefined4 local_2948;
  uint32_t local_2944;
  double local_2940;
  vector<int,_std::allocator<int>_> evts;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2868;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2850;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2838;
  _Vector_base<int,_std::allocator<int>_> local_2820;
  uniform_int_distribution<int> dis;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  undefined1 auVar23 [64];
  
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2948 = (undefined4)CONCAT71(in_register_00000089,verbose);
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_2950 = fn;
  local_2944 = iterations;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rd,(ulong)n,
             (allocator_type *)&gen);
  uVar11 = (ulong)m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&vdata,uVar11,(value_type *)&rd,(allocator_type *)&unified);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&rd);
  if ((char)local_2948 == '\x01' && !tabular) {
    printf("alignments: ");
    pvVar8 = vdata.
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar17 = vdata.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar17 != pvVar8;
        pvVar17 = pvVar17 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar17->
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar17->
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  rd.field_0._M_mt._M_x[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2820,&evts);
  LinuxEvents<0>::LinuxEvents(&unified,(vector<int,_std::allocator<int>_> *)&local_2820);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2820);
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            (&results,(long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device(&rd);
  local_296c = m;
  uVar5 = std::random_device::_M_getval();
  auVar23._8_56_ = extraout_var;
  auVar23._0_8_ = extraout_XMM1_Qa;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar5);
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0xffff;
  local_2968 = 1;
  uStack_2967 = 0;
  dVar20 = 0.0;
  local_2940 = (double)CONCAT71(local_2940._1_7_,!test);
  do {
    auVar24 = in_ZMM3._0_16_;
    auVar22 = auVar23._0_16_;
    auVar18 = in_ZMM2._0_16_;
    if (SUB84(dVar20,0) == local_2944) {
      uVar5 = 0;
      for (puVar13 = times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar13 !=
          times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
        uVar5 = uVar5 + *puVar13;
      }
      lVar16 = (long)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2838,&allresults);
      compute_mins(&mins,&local_2838);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2838);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2850,&allresults);
      compute_averages(&avg,&local_2850);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2850);
      auVar19 = vcvtusi2sd_avx512f(auVar22,n * 2);
      local_2940 = auVar19._0_8_ * 9.5367431640625e-07;
      if (tabular) {
        uVar11 = (ulong)local_2944;
        lVar16 = 0;
        uVar15 = 0;
        auVar22 = vcvtusi2sd_avx512f(auVar22,local_296c * n);
        local_2958 = auVar22._0_8_;
        for (; uVar11 != uVar15; uVar15 = uVar15 + 1) {
          auVar22 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,
                                       times.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15]);
          local_2950 = (pospopcnt_u16_method_type)(local_2940 / (auVar22._0_8_ / 1000000000.0));
          printf("%s\t%u\t%d\t",(fn_name->_M_dataplus)._M_p,CONCAT44(in_register_00000034,n),
                 uVar15 & 0xffffffff);
          auVar18 = vcvtuqq2pd_avx512vl(**(undefined1 (**) [16])
                                          ((long)&((allresults.
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          lVar16));
          auVar22 = vshufpd_avx(auVar18,auVar18,1);
          printf("%4.2f\t%4.3f\t%4.3f\t",auVar22._0_8_ / auVar18._0_8_,auVar18._0_8_ / local_2958,
                 auVar22._0_8_ / local_2958);
          puVar4 = *(undefined8 **)
                    ((long)&((allresults.
                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar16);
          printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar4,puVar4[1],puVar4[2],puVar4[3],puVar4[4]);
          printf("%u\t%4.2f\n",local_2950,
                 (ulong)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar15]);
          lVar16 = lVar16 + 0x18;
        }
      }
      else {
        if ((char)local_2948 == '\0') {
          auVar24 = vcvtusi2sd_avx512f(auVar22,*mins.
                                                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
          __format = "cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n";
          auVar22 = vcvtusi2sd_avx512f(auVar22,local_296c * n);
          dVar20 = auVar24._0_8_ / auVar22._0_8_;
          auVar18 = vcvtusi2sd_avx512f(auVar18,mins.
                                               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start[5]);
          p_Var21 = (pospopcnt_u16_method_type)(auVar18._0_8_ / auVar22._0_8_);
        }
        else {
          local_2958 = (double)((ulong)uVar5 / (ulong)(lVar16 >> 2));
          local_2950 = (pospopcnt_u16_method_type)(local_2940 / (local_2958 / 1000000000.0));
          auVar19 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                         mins.
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          auVar22 = vshufpd_avx(auVar19,auVar19,1);
          auVar18 = vcvtusi2sd_avx512f(auVar24,local_296c * n);
          printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
                 ,auVar22._0_8_ / auVar19._0_8_,auVar19._0_8_ / auVar18._0_8_,
                 auVar22._0_8_ / auVar18._0_8_);
          printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
                 ,*mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[1],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[2],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[3],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[4]);
          printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
                 ,*avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[2],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[3],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[4]);
          __format = "avg time: %f ns, %4.2f mb/s\n";
          dVar20 = local_2958;
          p_Var21 = local_2950;
        }
        printf(__format,dVar20,p_Var21);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&avg.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                (&mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
      bVar10 = local_2968;
      goto LAB_0011911c;
    }
    pvVar8 = vdata.
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2958 = dVar20;
    for (uVar15 = 0;
        uVar15 < (ulong)(((long)vdata.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0x18);
        uVar15 = uVar15 + 1) {
      puVar9 = pvVar8[uVar15].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar12 = 0;
          uVar12 < (ulong)((long)pvVar8[uVar15].
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 1);
          uVar12 = uVar12 + 1) {
        rVar6 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
        puVar9 = vdata.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9[uVar12] = (unsigned_short)rVar6;
        pvVar8 = vdata.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&avg,0x10,
               (allocator_type *)&local_2868);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&mins,uVar11,(value_type *)&avg,&local_296d);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&avg);
    for (lVar16 = 0; uVar11 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18) {
      puVar3 = *(uint16_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar16);
      pospopcnt_u16_scalar_naive
                (puVar3,(uint32_t)
                        ((ulong)(*(long *)((long)&((vdata.
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                          lVar16) - (long)puVar3) >> 1),
                 *(uint32_t **)
                  ((long)mins.
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16));
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2868,0x10,
               (allocator_type *)&local_296d);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&avg,uVar11,(value_type *)&local_2868,&local_2961);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2868);
    local_2960 = std::chrono::_V2::system_clock::now();
    LinuxEvents<0>::start(&unified);
    for (lVar16 = 0; uVar11 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18) {
      puVar3 = *(uint16_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar16);
      (*local_2950)(puVar3,(uint32_t)
                           ((ulong)(*(long *)((long)&((vdata.
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                             lVar16) - (long)puVar3) >> 1),
                    *(uint32_t **)
                     ((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar16));
    }
    LinuxEvents<0>::end(&unified,&results);
    iVar7 = std::chrono::_V2::system_clock::now();
    auVar23._8_56_ = extraout_var_00;
    auVar23._0_8_ = extraout_XMM1_Qa_00;
    lVar16 = 0;
    for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
        lVar16 = lVar16 + (ulong)*(uint *)((long)avg.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [uVar15 * 3] + lVar14 * 4);
      }
    }
    if (lVar16 == 0) {
      local_2960 = local_2960 & 0xffffffff00000000;
    }
    else {
      for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          iVar1 = *(int *)(mins.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15 * 3] + lVar16 * 4);
          iVar2 = *(int *)((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar15 * 3] + lVar16 * 4);
          if (iVar1 != iVar2 && local_2940._0_1_ == '\0') {
            puts("bug:");
            local_2960 = local_2960 & 0xffffffff00000000;
            printf("expected : ");
            print16((uint32_t *)
                    mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15 * 3]);
            printf("got      : ");
            print16((uint32_t *)
                    avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15 * 3]);
            goto LAB_00118dca;
          }
          local_2968 = local_2968 & iVar1 == iVar2;
        }
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back(&allresults,&results);
      local_2868._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar7 - (int)local_2960;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&times,(uint *)&local_2868);
      local_2960 = CONCAT44(local_2960._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
    }
LAB_00118dca:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&avg);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&mins);
    dVar20 = (double)(ulong)(SUB84(local_2958,0) + 1);
  } while ((char)local_2960 != '\0');
  bVar10 = 0;
LAB_0011911c:
  std::random_device::~random_device(&rd);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&allresults);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  LinuxEvents<0>::~LinuxEvents(&unified);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&vdata);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&evts.super__Vector_base<int,_std::allocator<int>_>);
  return (bool)(bVar10 & 1);
}

Assistant:

bool benchmarkMany(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>> vdata(m, std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>(n));
#else
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = ((2*n) / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = ((2*n) / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}